

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O3

void Am_Insert_Char_At_Cursor(Am_Object *text,char c,bool advance_cursor)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  Am_Value *pAVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  Am_String old_str;
  Am_String AStack_68;
  Am_Object local_60;
  Am_String local_58;
  undefined4 local_4c;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  Am_Object::Am_Object(&local_38,text);
  bVar2 = isJapanese(&local_38);
  Am_Object::~Am_Object(&local_38);
  if (bVar2) {
    Am_Object::Am_Object(&local_40,text);
    Am_Insert_JChar_At_Cursor(&local_40,c,advance_cursor);
    Am_Object::~Am_Object(&local_40);
  }
  else {
    pAVar4 = Am_Object::Get(text,0xad,0);
    uVar3 = Am_Value::operator_cast_to_int(pAVar4);
    if (-1 < (int)uVar3) {
      pAVar4 = Am_Object::Get(text,0xe4,0);
      bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
      if (bVar2) {
        Am_Object::Am_Object(&local_48,text);
        Am_Delete_Entire_String(&local_48);
        Am_Object::~Am_Object(&local_48);
      }
      local_4c = (undefined4)CONCAT71(in_register_00000011,advance_cursor);
      pAVar4 = Am_Object::Get(text,0xab,0);
      Am_String::Am_String(&AStack_68,pAVar4);
      pcVar5 = Am_String::operator_cast_to_char_(&AStack_68);
      sVar6 = strlen(pcVar5);
      uVar7 = (ulong)((int)sVar6 + 2);
      uVar9 = 0xffffffffffffffff;
      if (-1 < (long)uVar7) {
        uVar9 = uVar7;
      }
      pcVar5 = (char *)operator_new__(uVar9);
      pcVar8 = Am_String::operator_cast_to_char_(&AStack_68);
      uVar9 = (ulong)uVar3;
      memcpy(pcVar5,pcVar8,uVar9);
      pcVar5[uVar9] = c;
      pcVar8 = Am_String::operator_cast_to_char_(&AStack_68);
      memcpy(pcVar5 + uVar9 + 1,pcVar8 + uVar9,(long)(int)(((int)sVar6 - uVar3) + 1));
      Am_String::Am_String(&local_58,pcVar5,false);
      Am_Object::Set(text,0xab,&local_58,0);
      uVar1 = local_4c;
      Am_String::~Am_String(&local_58);
      if ((char)uVar1 != '\0') {
        Am_Object::Am_Object(&local_60,text);
        Am_Move_Cursor_Right(&local_60,1);
        Am_Object::~Am_Object(&local_60);
      }
      Am_String::~Am_String(&AStack_68);
    }
  }
  return;
}

Assistant:

void
Am_Insert_Char_At_Cursor(Am_Object text, char c, bool advance_cursor)
{

#ifndef _WIN32
  if (isJapanese(text)) {
    Am_Insert_JChar_At_Cursor(text, c, advance_cursor);
    return;
  }
#endif

  int cursor_index = text.Get(Am_CURSOR_INDEX);
  if (cursor_index >= 0) {
    if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
      Am_Delete_Entire_String(text);
    Am_String old_str = text.Get(Am_TEXT);
    int str_len = strlen(old_str);
    // +2 for the new character and the terminating \0
    char *new_str = new char[str_len + 2];
    memcpy(new_str, (const char *)old_str, sizeof(char) * cursor_index);
    new_str[cursor_index] = c;
    memcpy((void *)&new_str[cursor_index + 1],
           &((const char *)old_str)[cursor_index],
           // Copy the terminating \0 also
           (str_len - cursor_index + 1) * sizeof(char));
    text.Set(Am_TEXT, Am_String(new_str, false));
    if (advance_cursor == true)
      Am_Move_Cursor_Right(text, 1);
  }
}